

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_interfaces.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_0::GetLocationsForVariable
          (ValidationState_t *_,Instruction *entry_point,Instruction *variable,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *locations,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *output_index1_locations)

{
  uint16_t uVar1;
  byte bVar2;
  byte bVar3;
  undefined4 uVar4;
  bool bVar5;
  _Rb_tree_color _Var6;
  StorageClass SVar7;
  uint uVar8;
  ExecutionModel EVar9;
  mapped_type mVar10;
  spv_result_t sVar11;
  uint32_t uVar12;
  int iVar13;
  Instruction *pIVar14;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *psVar15;
  _Base_ptr p_Var16;
  iterator iVar17;
  _Rb_tree_color *p_Var18;
  size_type sVar19;
  mapped_type *pmVar20;
  _Head_base<2UL,_unsigned_int,_false> _Var21;
  uint uVar22;
  _Rb_tree_color _Var23;
  ValidationState_t *pVVar24;
  char *pcVar25;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  undefined4 uVar26;
  _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this_00;
  ulong uVar27;
  bool bVar28;
  __ireturn_type _Var29;
  uint32_t check;
  ValidationState_t *local_318;
  uint local_30c;
  Instruction *local_308;
  _Rb_tree_color local_300;
  uint32_t num_locations_1;
  ulong local_2f8;
  ulong local_2f0;
  _Rb_tree_color local_2e8;
  undefined4 uStack_2e4;
  _Rb_tree_color local_2dc;
  Instruction *local_2d8;
  Instruction *local_2d0;
  _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_2c8;
  _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_2c0;
  string local_2b8;
  uint32_t num_locations;
  uint uStack_294;
  size_type local_290;
  __node_base local_288;
  size_type sStack_280;
  float local_278;
  size_t local_270;
  __node_base_ptr p_Stack_268;
  string storage_class;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  member_locations;
  undefined1 local_208 [5];
  char local_203;
  spv_result_t local_38;
  
  bVar2 = 0;
  local_2d0 = entry_point;
  local_2c8 = (_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)locations;
  local_2c0 = (_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)output_index1_locations;
  _Var6 = Instruction::GetOperandAs<spv::ExecutionModel>(entry_point,0);
  local_300 = _Var6;
  SVar7 = Instruction::GetOperandAs<spv::StorageClass>(variable,2);
  uVar8 = Instruction::GetOperandAs<unsigned_int>(variable,0);
  pIVar14 = ValidationState_t::FindDef(_,uVar8);
  local_30c = Instruction::GetOperandAs<unsigned_int>(pIVar14,2);
  local_308 = ValidationState_t::FindDef(_,local_30c);
  local_318 = _;
  local_2d8 = variable;
  psVar15 = ValidationState_t::id_decorations(_,(variable->inst_).result_id);
  p_Var16 = (psVar15->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar3 = 0;
  bVar5 = false;
  local_2dc = _S_red;
  bVar28 = false;
  local_2f8 = 0;
  local_2e8 = _S_red;
  local_2f0 = 0;
  for (; pVVar24 = local_318,
      (_Rb_tree_header *)p_Var16 != &(psVar15->_M_t)._M_impl.super__Rb_tree_header;
      p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
    _Var23 = p_Var16[1]._M_color;
    if (_Var23 == 0xf) {
      bVar5 = true;
    }
    else if (_Var23 == 0x1e) {
      local_2e8 = (p_Var16[1]._M_parent)->_M_color;
      local_2f0 = CONCAT71((uint7)(uint3)(local_2e8 >> 8),1);
    }
    else if (_Var23 == 0x1f) {
      local_2f8 = (ulong)(p_Var16[1]._M_parent)->_M_color;
    }
    else if (_Var23 == 0x20) {
      if (SVar7 != Output || _Var6 != 4) {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_208,local_318,SPV_ERROR_INVALID_DATA,local_2d8);
        std::operator<<((ostream *)local_208,
                        "Index can only be applied to Fragment output variables");
        goto LAB_001cbd7b;
      }
      local_2dc = (p_Var16[1]._M_parent)->_M_color;
      bVar28 = true;
    }
    else if (_Var23 == 0x1499) {
      bVar3 = 1;
    }
    else if (_Var23 == 0x14a5) {
      if (local_300 != 4) {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_208,local_318,SPV_ERROR_INVALID_DATA,local_2d8);
        ValidationState_t::VkErrorID_abi_cxx11_
                  ((string *)&member_locations,pVVar24,0x1a79,(char *)0x0);
        std::operator<<((ostream *)local_208,(string *)&member_locations);
        pcVar25 = "PerVertexKHR can only be applied to Fragment Execution Models";
        goto LAB_001cbd63;
      }
      bVar2 = 1;
      if (((local_308->inst_).opcode & 0xfffe) != 0x1c) {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_208,local_318,SPV_ERROR_INVALID_DATA,local_2d8);
        ValidationState_t::VkErrorID_abi_cxx11_
                  ((string *)&member_locations,pVVar24,0x1a7a,(char *)0x0);
        std::operator<<((ostream *)local_208,(string *)&member_locations);
        pcVar25 = "PerVertexKHR must be declared as arrays";
        goto LAB_001cbd63;
      }
    }
    else if (_Var23 == 0xb) {
      return SPV_SUCCESS;
    }
  }
  EVar9 = Instruction::GetOperandAs<spv::ExecutionModel>(local_2d0,0);
  pVVar24 = local_318;
  pIVar14 = local_308;
  uVar8 = local_30c;
  switch(EVar9) {
  case ExecutionModelTessellationControl:
    break;
  case ExecutionModelTessellationEvaluation:
    bVar5 = (bool)(SVar7 == Output | bVar5);
    break;
  case ExecutionModelGeometry:
    bVar5 = SVar7 == Output;
    break;
  case ExecutionModelFragment:
    bVar5 = !(bool)(SVar7 != Output & bVar2);
    break;
  default:
    if (EVar9 == ExecutionModelMeshNV) {
      bVar5 = (bool)(SVar7 != Output | bVar3);
      break;
    }
    goto LAB_001cb84b;
  }
  if ((!bVar5) && (((local_308->inst_).opcode & 0xfffe) == 0x1c)) {
    uVar8 = Instruction::GetOperandAs<unsigned_int>(local_308,1);
    pIVar14 = ValidationState_t::FindDef(pVVar24,uVar8);
  }
LAB_001cb84b:
  if (((pIVar14->inst_).opcode == 0x1e) &&
     (bVar5 = ValidationState_t::HasDecoration(pVVar24,uVar8,BuiltIn), bVar5)) {
    return SPV_SUCCESS;
  }
  bVar5 = ValidationState_t::HasDecoration(pVVar24,uVar8,Block);
  uVar27 = local_2f0;
  if (!bVar5 && (local_2f0 & 1) == 0) {
    uVar1 = (pIVar14->inst_).opcode;
    ValidationState_t::diag((DiagnosticStream *)local_208,pVVar24,SPV_ERROR_INVALID_DATA,local_2d8);
    ValidationState_t::VkErrorID_abi_cxx11_
              ((string *)&member_locations,pVVar24,uVar1 == 0x1e | 0x1334,(char *)0x0);
    std::operator<<((ostream *)local_208,(string *)&member_locations);
    pcVar25 = "Variable must be decorated with a location";
LAB_001cbd63:
    std::operator<<((ostream *)local_208,pcVar25);
    std::__cxx11::string::_M_dispose();
LAB_001cbd7b:
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    return local_38;
  }
  pcVar25 = "output";
  if (SVar7 != Output) {
    pcVar25 = "input";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&storage_class,pcVar25,(allocator<char> *)local_208);
  if ((uVar27 & 1) == 0) {
    member_locations._M_h._M_buckets = &member_locations._M_h._M_single_bucket;
    member_locations._M_h._M_bucket_count = 1;
    member_locations._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    member_locations._M_h._M_element_count = 0;
    member_locations._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    member_locations._M_h._M_rehash_policy._M_next_resize = 0;
    member_locations._M_h._M_single_bucket = (__node_base_ptr)0x0;
    _num_locations = &p_Stack_268;
    local_290 = 1;
    local_288._M_nxt = (_Hash_node_base *)0x0;
    sStack_280 = 0;
    local_278 = 1.0;
    local_270 = 0;
    p_Stack_268 = (__node_base_ptr)0x0;
    psVar15 = ValidationState_t::id_decorations(pVVar24,uVar8);
    for (p_Var16 = (psVar15->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var16 != &(psVar15->_M_t)._M_impl.super__Rb_tree_header;
        p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
      if (p_Var16[1]._M_color == 0x1f) {
        local_208._0_4_ = p_Var16[2]._M_color;
        iVar17 = std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)&num_locations,(key_type_conflict *)local_208);
        if (iVar17.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur == (__node_type *)0x0) {
          _Var6 = (p_Var16[1]._M_parent)->_M_color;
          local_208._0_4_ = p_Var16[2]._M_color;
          this = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)&num_locations;
LAB_001cba7b:
          p_Var18 = std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)this,(key_type *)local_208);
          *p_Var18 = _Var6;
          goto LAB_001cba8d;
        }
        if (*(_Rb_tree_color *)
             ((long)iVar17.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                    _M_cur + 0xc) == (p_Var16[1]._M_parent)->_M_color) goto LAB_001cba8d;
        ValidationState_t::diag
                  ((DiagnosticStream *)local_208,local_318,SPV_ERROR_INVALID_DATA,pIVar14);
        std::operator<<((ostream *)local_208,"Member index ");
        std::ostream::operator<<((DiagnosticStream *)local_208,p_Var16[2]._M_color);
        pcVar25 = " has conflicting component assignments";
LAB_001cc115:
        std::operator<<((ostream *)local_208,pcVar25);
        sVar11 = local_38;
LAB_001cc127:
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        goto LAB_001cc12c;
      }
      if (p_Var16[1]._M_color == 0x1e) {
        local_208._0_4_ = p_Var16[2]._M_color;
        iVar17 = std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&member_locations._M_h,(key_type_conflict *)local_208);
        if (iVar17.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur == (__node_type *)0x0) {
          _Var6 = (p_Var16[1]._M_parent)->_M_color;
          local_208._0_4_ = p_Var16[2]._M_color;
          this = &member_locations._M_h;
          goto LAB_001cba7b;
        }
        if (*(_Rb_tree_color *)
             ((long)iVar17.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                    _M_cur + 0xc) != (p_Var16[1]._M_parent)->_M_color) {
          ValidationState_t::diag
                    ((DiagnosticStream *)local_208,local_318,SPV_ERROR_INVALID_DATA,pIVar14);
          std::operator<<((ostream *)local_208,"Member index ");
          std::ostream::operator<<((DiagnosticStream *)local_208,p_Var16[2]._M_color);
          pcVar25 = " has conflicting location assignments";
          goto LAB_001cc115;
        }
      }
LAB_001cba8d:
    }
    uVar27 = 1;
    pVVar24 = local_318;
    local_308 = pIVar14;
    while (pIVar14 = local_308,
          uVar27 < (ulong)((long)(local_308->operands_).
                                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_308->operands_).
                                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4)) {
      _Var21._M_head_impl = (int)uVar27 - _S_black;
      local_208._0_4_ = _Var21._M_head_impl;
      iVar17 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&member_locations._M_h,(key_type_conflict *)local_208);
      if (iVar17.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
          _M_cur == (__node_type *)0x0) {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_208,pVVar24,SPV_ERROR_INVALID_DATA,pIVar14);
        bVar5 = false;
        ValidationState_t::VkErrorID_abi_cxx11_(&local_2b8,pVVar24,0x1337,(char *)0x0);
        std::operator<<((ostream *)local_208,(string *)&local_2b8);
        std::operator<<((ostream *)local_208,"Member index ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_208);
        std::operator<<((ostream *)local_208," is missing a location assignment");
        std::__cxx11::string::_M_dispose();
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        sVar11 = local_38;
        goto LAB_001cc12f;
      }
      local_2e8 = *(_Rb_tree_color *)
                   ((long)iVar17.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                          ._M_cur + 0xc);
      uStack_2e4 = 0;
      local_2f8 = uVar27;
      uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar14,uVar27);
      pIVar14 = ValidationState_t::FindDef(pVVar24,uVar8);
      num_locations_1 = 0;
      sVar11 = NumConsumedLocations(pVVar24,pIVar14,&num_locations_1);
      uVar26 = (spv_result_t)local_2f0;
      if (sVar11 != SPV_SUCCESS) goto LAB_001cc12c;
      uVar12 = NumConsumedComponents(pVVar24,pIVar14);
      local_208._0_4_ = _Var21._M_head_impl;
      sVar19 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)&num_locations,(key_type_conflict *)local_208);
      if (sVar19 == 0) {
        mVar10 = 0;
      }
      else {
        local_208._0_4_ = _Var21._M_head_impl;
        pmVar20 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&num_locations,(key_type *)local_208);
        mVar10 = *pmVar20;
      }
      pVVar24 = local_318;
      uVar8 = local_2e8 * 4;
      uVar4 = (spv_result_t)local_2f0;
      if (uVar8 < 0x4000) {
        if ((2 < uVar12 - 1) || ((pIVar14->inst_).opcode != 0x1c)) {
          uVar22 = mVar10 + uVar8 + uVar12;
          check = mVar10 + uVar8;
          if (uVar12 == 0) {
            uVar22 = (local_2e8 + num_locations_1) * 4;
            check = uVar8;
          }
          iVar13 = (int)local_2f8;
LAB_001cbceb:
          if (check < uVar22) {
            _Var29 = std::__detail::
                     _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::insert(local_2c8,&check);
            if (((undefined1  [16])_Var29 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
            goto code_r0x001cbd0f;
            ValidationState_t::diag
                      ((DiagnosticStream *)local_208,pVVar24,SPV_ERROR_INVALID_DATA,local_2d0);
            ValidationState_t::VkErrorID_abi_cxx11_
                      (&local_2b8,pVVar24,(SVar7 == Output) + 0x2211,(char *)0x0);
            std::operator<<((ostream *)local_208,(string *)&local_2b8);
            std::operator<<((ostream *)local_208,"Entry-point has conflicting ");
            std::operator<<((ostream *)local_208,(string *)&storage_class);
            std::operator<<((ostream *)local_208," location assignment at location ");
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            std::operator<<((ostream *)local_208,", component ");
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            sVar11 = local_38;
LAB_001cc08c:
            std::__cxx11::string::_M_dispose();
            goto LAB_001cc127;
          }
          goto LAB_001cbc4d;
        }
        _Var6 = local_2e8;
        while (uVar22 = mVar10, _Var6 < num_locations_1 + local_2e8) {
          for (; local_300 = _Var6, uVar22 < uVar12 + mVar10; uVar22 = uVar22 + 1) {
            check = uVar8 + uVar22;
            _Var29 = std::__detail::
                     _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::insert(local_2c8,&check);
            pVVar24 = local_318;
            if (((undefined1  [16])_Var29 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              ValidationState_t::diag
                        ((DiagnosticStream *)local_208,local_318,SPV_ERROR_INVALID_DATA,local_2d0);
              ValidationState_t::VkErrorID_abi_cxx11_
                        (&local_2b8,pVVar24,(SVar7 == Output) + 0x2211,(char *)0x0);
              std::operator<<((ostream *)local_208,(string *)&local_2b8);
              std::operator<<((ostream *)local_208,"Entry-point has conflicting ");
              std::operator<<((ostream *)local_208,(string *)&storage_class);
              std::operator<<((ostream *)local_208," location assignment at location ");
              std::ostream::_M_insert<unsigned_long>((ulong)local_208);
              std::operator<<((ostream *)local_208,", component ");
              std::ostream::_M_insert<unsigned_long>((ulong)local_208);
              sVar11 = local_38;
              goto LAB_001cc08c;
            }
            _Var6 = local_300;
          }
          uVar8 = uVar8 + 4;
          _Var6 = local_300 + _S_black;
        }
      }
      iVar13 = (int)local_2f8;
      pVVar24 = local_318;
      uVar26 = uVar4;
LAB_001cbc4d:
      local_2f0 = CONCAT44(local_2f0._4_4_,uVar26);
      uVar27 = (ulong)(iVar13 + 1);
    }
    bVar5 = true;
    sVar11 = (spv_result_t)local_2f0;
    goto LAB_001cc12f;
  }
  if ((pIVar14->inst_).opcode == 0x1c) {
    uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar14,2);
    ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,pVVar24,uVar8);
    if ((local_203 != '\x01') || (_Var6 = local_208._0_4_, local_208[4] == false)) {
      _Var6 = _S_black;
    }
    uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar14,1);
    pIVar14 = ValidationState_t::FindDef(pVVar24,uVar8);
  }
  else {
    _Var6 = _S_black;
  }
  _num_locations = (__node_base_ptr *)((ulong)uStack_294 << 0x20);
  sVar11 = NumConsumedLocations(pVVar24,pIVar14,&num_locations);
  if (sVar11 != SPV_SUCCESS) goto LAB_001cc151;
  uVar12 = NumConsumedComponents(pVVar24,pIVar14);
  this_00 = local_2c0;
  if (local_2dc != _S_black) {
    this_00 = local_2c8;
  }
  if (!bVar28) {
    this_00 = local_2c8;
  }
  for (_Var23 = _S_red; _Var23 != _Var6; _Var23 = _Var23 + _S_black) {
    iVar13 = num_locations * _Var23 + local_2e8;
    uVar8 = iVar13 * 4;
    if (0x3fff < uVar8) break;
    local_2b8._M_dataplus._M_p._0_4_ = (int)local_2f8 + uVar8;
    uVar22 = (uint)local_2b8._M_dataplus._M_p + uVar12;
    if (uVar12 == 0) {
      local_2b8._M_dataplus._M_p._0_4_ = uVar8;
      uVar22 = (iVar13 + num_locations) * 4;
    }
    for (; (uint)local_2b8._M_dataplus._M_p < uVar22;
        local_2b8._M_dataplus._M_p._0_4_ = (uint)local_2b8._M_dataplus._M_p + 1) {
      _Var29 = std::__detail::
               _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::insert(this_00,(value_type *)&local_2b8);
      pVVar24 = local_318;
      if (((undefined1  [16])_Var29 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_208,local_318,SPV_ERROR_INVALID_DATA,local_2d0);
        ValidationState_t::VkErrorID_abi_cxx11_
                  ((string *)&member_locations,pVVar24,(SVar7 == Output) + 0x2211,(char *)0x0);
        std::operator<<((ostream *)local_208,(string *)&member_locations);
        std::operator<<((ostream *)local_208,"Entry-point has conflicting ");
        std::operator<<((ostream *)local_208,(string *)&storage_class);
        std::operator<<((ostream *)local_208," location assignment at location ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_208);
        std::operator<<((ostream *)local_208,", component ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_208);
        std::__cxx11::string::_M_dispose();
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        sVar11 = local_38;
        goto LAB_001cc151;
      }
    }
  }
LAB_001cc14e:
  sVar11 = SPV_SUCCESS;
LAB_001cc151:
  std::__cxx11::string::_M_dispose();
  return sVar11;
code_r0x001cbd0f:
  check = check + 1;
  goto LAB_001cbceb;
LAB_001cc12c:
  bVar5 = false;
LAB_001cc12f:
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&num_locations);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&member_locations._M_h);
  if (!bVar5) goto LAB_001cc151;
  goto LAB_001cc14e;
}

Assistant:

spv_result_t GetLocationsForVariable(
    ValidationState_t& _, const Instruction* entry_point,
    const Instruction* variable, std::unordered_set<uint32_t>* locations,
    std::unordered_set<uint32_t>* output_index1_locations) {
  const bool is_fragment = entry_point->GetOperandAs<spv::ExecutionModel>(0) ==
                           spv::ExecutionModel::Fragment;
  const auto sc_index = 2u;
  const bool is_output = variable->GetOperandAs<spv::StorageClass>(sc_index) ==
                         spv::StorageClass::Output;
  auto ptr_type_id = variable->GetOperandAs<uint32_t>(0);
  auto ptr_type = _.FindDef(ptr_type_id);
  auto type_id = ptr_type->GetOperandAs<uint32_t>(2);
  auto type = _.FindDef(type_id);

  // Check for Location, Component and Index decorations on the variable. The
  // validator allows duplicate decorations if the location/component/index are
  // equal. Also track Patch and PerTaskNV decorations.
  bool has_location = false;
  uint32_t location = 0;
  uint32_t component = 0;
  bool has_index = false;
  uint32_t index = 0;
  bool has_patch = false;
  bool has_per_task_nv = false;
  bool has_per_vertex_khr = false;
  // Duplicate Location, Component, Index are checked elsewhere.
  for (auto& dec : _.id_decorations(variable->id())) {
    if (dec.dec_type() == spv::Decoration::Location) {
      has_location = true;
      location = dec.params()[0];
    } else if (dec.dec_type() == spv::Decoration::Component) {
      component = dec.params()[0];
    } else if (dec.dec_type() == spv::Decoration::Index) {
      if (!is_output || !is_fragment) {
        return _.diag(SPV_ERROR_INVALID_DATA, variable)
               << "Index can only be applied to Fragment output variables";
      }
      has_index = true;
      index = dec.params()[0];
    } else if (dec.dec_type() == spv::Decoration::BuiltIn) {
      // Don't check built-ins.
      return SPV_SUCCESS;
    } else if (dec.dec_type() == spv::Decoration::Patch) {
      has_patch = true;
    } else if (dec.dec_type() == spv::Decoration::PerTaskNV) {
      has_per_task_nv = true;
    } else if (dec.dec_type() == spv::Decoration::PerVertexKHR) {
      if (!is_fragment) {
        return _.diag(SPV_ERROR_INVALID_DATA, variable)
               << _.VkErrorID(6777)
               << "PerVertexKHR can only be applied to Fragment Execution "
                  "Models";
      }
      if (type->opcode() != spv::Op::OpTypeArray &&
          type->opcode() != spv::Op::OpTypeRuntimeArray) {
        return _.diag(SPV_ERROR_INVALID_DATA, variable)
               << _.VkErrorID(6778)
               << "PerVertexKHR must be declared as arrays";
      }
      has_per_vertex_khr = true;
    }
  }

  // Vulkan 14.1.3: Tessellation control and mesh per-vertex outputs and
  // tessellation control, evaluation and geometry per-vertex inputs have a
  // layer of arraying that is not included in interface matching.
  bool is_arrayed = false;
  switch (entry_point->GetOperandAs<spv::ExecutionModel>(0)) {
    case spv::ExecutionModel::TessellationControl:
      if (!has_patch) {
        is_arrayed = true;
      }
      break;
    case spv::ExecutionModel::TessellationEvaluation:
      if (!is_output && !has_patch) {
        is_arrayed = true;
      }
      break;
    case spv::ExecutionModel::Geometry:
      if (!is_output) {
        is_arrayed = true;
      }
      break;
    case spv::ExecutionModel::Fragment:
      if (!is_output && has_per_vertex_khr) {
        is_arrayed = true;
      }
      break;
    case spv::ExecutionModel::MeshNV:
      if (is_output && !has_per_task_nv) {
        is_arrayed = true;
      }
      break;
    default:
      break;
  }

  // Unpack arrayness.
  if (is_arrayed && (type->opcode() == spv::Op::OpTypeArray ||
                     type->opcode() == spv::Op::OpTypeRuntimeArray)) {
    type_id = type->GetOperandAs<uint32_t>(1);
    type = _.FindDef(type_id);
  }

  if (type->opcode() == spv::Op::OpTypeStruct) {
    // Don't check built-ins.
    if (_.HasDecoration(type_id, spv::Decoration::BuiltIn)) return SPV_SUCCESS;
  }

  // Only block-decorated structs don't need a location on the variable.
  const bool is_block = _.HasDecoration(type_id, spv::Decoration::Block);
  if (!has_location && !is_block) {
    const auto vuid = (type->opcode() == spv::Op::OpTypeStruct) ? 4917 : 4916;
    return _.diag(SPV_ERROR_INVALID_DATA, variable)
           << _.VkErrorID(vuid) << "Variable must be decorated with a location";
  }

  const std::string storage_class = is_output ? "output" : "input";
  if (has_location) {
    auto sub_type = type;
    bool is_int = false;
    bool is_const = false;
    uint32_t array_size = 1;
    // If the variable is still arrayed, mark the locations/components per
    // index.
    if (type->opcode() == spv::Op::OpTypeArray) {
      // Determine the array size if possible and get the element type.
      std::tie(is_int, is_const, array_size) =
          _.EvalInt32IfConst(type->GetOperandAs<uint32_t>(2));
      if (!is_int || !is_const) array_size = 1;
      auto sub_type_id = type->GetOperandAs<uint32_t>(1);
      sub_type = _.FindDef(sub_type_id);
    }

    uint32_t num_locations = 0;
    if (auto error = NumConsumedLocations(_, sub_type, &num_locations))
      return error;
    uint32_t num_components = NumConsumedComponents(_, sub_type);

    for (uint32_t array_idx = 0; array_idx < array_size; ++array_idx) {
      uint32_t array_location = location + (num_locations * array_idx);
      uint32_t start = array_location * 4;
      if (kMaxLocations <= start) {
        // Too many locations, give up.
        break;
      }

      uint32_t end = (array_location + num_locations) * 4;
      if (num_components != 0) {
        start += component;
        end = array_location * 4 + component + num_components;
      }

      auto locs = locations;
      if (has_index && index == 1) locs = output_index1_locations;

      for (uint32_t i = start; i < end; ++i) {
        if (!locs->insert(i).second) {
          return _.diag(SPV_ERROR_INVALID_DATA, entry_point)
                 << (is_output ? _.VkErrorID(8722) : _.VkErrorID(8721))
                 << "Entry-point has conflicting " << storage_class
                 << " location assignment at location " << i / 4
                 << ", component " << i % 4;
        }
      }
    }
  } else {
    // For Block-decorated structs with no location assigned to the variable,
    // each member of the block must be assigned a location. Also record any
    // member component assignments. The validator allows duplicate decorations
    // if they agree on the location/component.
    std::unordered_map<uint32_t, uint32_t> member_locations;
    std::unordered_map<uint32_t, uint32_t> member_components;
    for (auto& dec : _.id_decorations(type_id)) {
      if (dec.dec_type() == spv::Decoration::Location) {
        auto where = member_locations.find(dec.struct_member_index());
        if (where == member_locations.end()) {
          member_locations[dec.struct_member_index()] = dec.params()[0];
        } else if (where->second != dec.params()[0]) {
          return _.diag(SPV_ERROR_INVALID_DATA, type)
                 << "Member index " << dec.struct_member_index()
                 << " has conflicting location assignments";
        }
      } else if (dec.dec_type() == spv::Decoration::Component) {
        auto where = member_components.find(dec.struct_member_index());
        if (where == member_components.end()) {
          member_components[dec.struct_member_index()] = dec.params()[0];
        } else if (where->second != dec.params()[0]) {
          return _.diag(SPV_ERROR_INVALID_DATA, type)
                 << "Member index " << dec.struct_member_index()
                 << " has conflicting component assignments";
        }
      }
    }

    for (uint32_t i = 1; i < type->operands().size(); ++i) {
      auto where = member_locations.find(i - 1);
      if (where == member_locations.end()) {
        return _.diag(SPV_ERROR_INVALID_DATA, type)
               << _.VkErrorID(4919) << "Member index " << i - 1
               << " is missing a location assignment";
      }

      location = where->second;
      auto member = _.FindDef(type->GetOperandAs<uint32_t>(i));
      uint32_t num_locations = 0;
      if (auto error = NumConsumedLocations(_, member, &num_locations))
        return error;

      // If the component is not specified, it is assumed to be zero.
      uint32_t num_components = NumConsumedComponents(_, member);
      component = 0;
      if (member_components.count(i - 1)) {
        component = member_components[i - 1];
      }

      uint32_t start = location * 4;
      if (kMaxLocations <= start) {
        // Too many locations, give up.
        continue;
      }

      if (member->opcode() == spv::Op::OpTypeArray && num_components >= 1 &&
          num_components < 4) {
        // When an array has an element that takes less than a location in
        // size, calculate the used locations in a strided manner.
        for (uint32_t l = location; l < num_locations + location; ++l) {
          for (uint32_t c = component; c < component + num_components; ++c) {
            uint32_t check = 4 * l + c;
            if (!locations->insert(check).second) {
              return _.diag(SPV_ERROR_INVALID_DATA, entry_point)
                     << (is_output ? _.VkErrorID(8722) : _.VkErrorID(8721))
                     << "Entry-point has conflicting " << storage_class
                     << " location assignment at location " << l
                     << ", component " << c;
            }
          }
        }
      } else {
        // TODO: There is a hole here is the member is an array of 3- or
        // 4-element vectors of 64-bit types.
        uint32_t end = (location + num_locations) * 4;
        if (num_components != 0) {
          start += component;
          end = location * 4 + component + num_components;
        }
        for (uint32_t l = start; l < end; ++l) {
          if (!locations->insert(l).second) {
            return _.diag(SPV_ERROR_INVALID_DATA, entry_point)
                   << (is_output ? _.VkErrorID(8722) : _.VkErrorID(8721))
                   << "Entry-point has conflicting " << storage_class
                   << " location assignment at location " << l / 4
                   << ", component " << l % 4;
          }
        }
      }
    }
  }

  return SPV_SUCCESS;
}